

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O3

void KeccakP1600Round(tKeccakLane *state,uint indexRound)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  tKeccakLane *ptVar5;
  uint *puVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  tKeccakLane *ptVar10;
  uint x;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  tKeccakLane tVar17;
  ulong uVar18;
  ulong auStack_128 [6];
  tKeccakLane local_f8 [15];
  tKeccakLane D [5];
  tKeccakLane C [5];
  
  lVar3 = 0;
  do {
    local_f8[lVar3] =
         state[lVar3 + 5] ^ state[lVar3] ^ state[lVar3 + 10] ^ state[lVar3 + 0xf] ^
         state[lVar3 + 0x14];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  lVar3 = 0;
  do {
    lVar12 = lVar3 + 1;
    lVar8 = 0;
    if (lVar3 != 4) {
      lVar8 = lVar12;
    }
    uVar13 = (ulong)((int)lVar3 - 1);
    if (lVar3 == 0) {
      uVar13 = 4;
    }
    auStack_128[lVar3] =
         (local_f8[lVar8] << 1 | (ulong)((long)local_f8[lVar8] < 0)) ^ local_f8[uVar13];
    lVar3 = lVar12;
  } while (lVar12 != 5);
  lVar3 = 0;
  ptVar5 = state;
  do {
    uVar13 = auStack_128[lVar3];
    lVar12 = 0;
    do {
      *(ulong *)((long)ptVar5 + lVar12) = *(ulong *)((long)ptVar5 + lVar12) ^ uVar13;
      lVar12 = lVar12 + 0x28;
    } while (lVar12 != 200);
    lVar3 = lVar3 + 1;
    ptVar5 = ptVar5 + 1;
  } while (lVar3 != 5);
  puVar6 = KeccakRhoOffsets;
  lVar3 = 0;
  lVar12 = 0;
  do {
    lVar16 = 0;
    lVar8 = 0;
    do {
      if ((int)lVar16 == 0 && (int)lVar12 == 0) {
        tVar17 = state[lVar16];
        lVar2 = lVar16;
      }
      else {
        uVar13 = *(ulong *)((long)state + lVar16 * 8 + lVar3);
        tVar17 = uVar13 >> (-(byte)puVar6[lVar16] & 0x3f) ^ uVar13 << ((byte)puVar6[lVar16] & 0x3f);
        lVar2 = lVar8 * 5;
      }
      state[lVar2 + lVar12] = tVar17;
      lVar8 = lVar8 + 1;
      lVar16 = lVar16 + 5;
    } while (lVar16 != 0x19);
    lVar12 = lVar12 + 1;
    puVar6 = puVar6 + 1;
    lVar3 = lVar3 + 8;
  } while (lVar12 != 5);
  ptVar5 = local_f8;
  lVar3 = 0;
  ptVar10 = state;
  do {
    lVar12 = 0;
    do {
      *(undefined8 *)((long)ptVar5 + lVar12) = *(undefined8 *)((long)ptVar10 + lVar12);
      lVar12 = lVar12 + 0x28;
    } while (lVar12 != 200);
    lVar3 = lVar3 + 1;
    ptVar5 = ptVar5 + 1;
    ptVar10 = ptVar10 + 1;
  } while (lVar3 != 5);
  uVar4 = 0;
  ptVar5 = local_f8;
  iVar11 = 0;
  lVar3 = 0;
  do {
    lVar12 = 0;
    ptVar10 = state;
    iVar7 = iVar11;
    uVar15 = uVar4;
    do {
      ptVar10[iVar7 + (uVar15 / 5) * -0x19] = ptVar5[lVar12];
      lVar12 = lVar12 + 5;
      ptVar10 = ptVar10 + 1;
      iVar7 = iVar7 + 0xf;
      uVar15 = uVar15 + 3;
    } while (lVar12 != 0x19);
    lVar3 = lVar3 + 1;
    iVar11 = iVar11 + 10;
    uVar4 = uVar4 + 2;
    ptVar5 = ptVar5 + 1;
  } while (lVar3 != 5);
  iVar11 = 0;
  uVar13 = 0;
  ptVar5 = state;
  do {
    uVar14 = (ulong)(uint)((int)((uVar13 & 0xffffffff) / 5) * -0x19 + (int)uVar13 * 5);
    uVar9 = 0;
    do {
      uVar1 = uVar9 + 1;
      uVar18 = 0;
      if (uVar9 != 4) {
        uVar18 = uVar1;
      }
      iVar7 = 2;
      if (2 < uVar9) {
        iVar7 = -3;
      }
      local_f8[uVar9] =
           ~state[uVar13 * 5 + uVar18] & state[(uint)(iVar7 + iVar11 + (int)uVar9)] ^ ptVar5[uVar9];
      uVar9 = uVar1;
    } while (uVar1 != 5);
    state[uVar14 + 4] = local_f8[4];
    state[uVar14 + 2] = local_f8[2];
    (state + uVar14 + 2)[1] = local_f8[3];
    state[uVar14] = local_f8[0];
    (state + uVar14)[1] = local_f8[1];
    uVar13 = uVar13 + 1;
    iVar11 = iVar11 + 5;
    ptVar5 = ptVar5 + 5;
  } while (uVar13 != 5);
  *state = *state ^ KeccakRoundConstants[indexRound];
  return;
}

Assistant:

void KeccakP1600Round(tKeccakLane *state, unsigned int indexRound)
{
#ifdef KeccakReference
    displayRoundNumber(3, indexRound);
#endif

    theta(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After theta", state, 1600);
#endif

    rho(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After rho", state, 1600);
#endif

    pi(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After pi", state, 1600);
#endif

    chi(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After chi", state, 1600);
#endif

    iota(state, indexRound);
#ifdef KeccakReference
    displayStateAsLanes(3, "After iota", state, 1600);
#endif
}